

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaemonClient.cpp
# Opt level: O0

bool __thiscall
xmrig::DaemonClient::parseResponse(DaemonClient *this,int64_t id,Value *result,Value *error)

{
  bool bVar1;
  uint16_t uVar2;
  uint uVar3;
  uint uVar4;
  Type pGVar5;
  Ch *pCVar6;
  String *this_00;
  char *name;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RCX;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RDX;
  BaseClient *in_RSI;
  BaseClient *in_RDI;
  int code;
  char *message;
  DaemonClient *in_stack_00000090;
  int *in_stack_000001e8;
  Value *in_stack_000001f0;
  DaemonClient *in_stack_000001f8;
  char *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  Ch *in_stack_ffffffffffffffb8;
  bool local_1;
  
  if (in_RSI == (BaseClient *)0xffffffffffffffff) {
    local_1 = false;
  }
  else {
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsObject(in_RCX);
    if (bVar1) {
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffa8);
      pCVar6 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(pGVar5);
      bVar1 = BaseClient::handleSubmitResponse(in_RSI,(int64_t)in_RDX,(char *)in_RCX);
      if ((!bVar1) && (bVar1 = BaseClient::isQuiet(in_RDI), !bVar1)) {
        this_00 = Pool::host((Pool *)0x1eb3f0);
        name = String::data(this_00);
        uVar2 = Pool::port((Pool *)0x1eb40d);
        uVar3 = (uint)uVar2;
        pGVar5 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)(ulong)CONCAT24(uVar2,in_stack_ffffffffffffffb0),name);
        uVar4 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetInt(pGVar5);
        Log::print(ERR,"[%s:%d] error: \x1b[1;31m\"%s\"\x1b[0m\x1b[0;31m, code: %d",name,
                   (ulong)uVar3,pCVar6,(ulong)uVar4);
      }
      local_1 = false;
    }
    else {
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsObject(in_RDX);
      if (bVar1) {
        bVar1 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)in_RDI,in_stack_ffffffffffffffb8);
        if ((bVar1) &&
           (bVar1 = parseJob(in_stack_000001f8,in_stack_000001f0,in_stack_000001e8), bVar1)) {
          local_1 = true;
        }
        else {
          bVar1 = BaseClient::handleSubmitResponse(in_RSI,(int64_t)in_RDX,(char *)in_RCX);
          if (bVar1) {
            getBlockTemplate(in_stack_00000090);
            local_1 = true;
          }
          else {
            local_1 = false;
          }
        }
      }
      else {
        local_1 = false;
      }
    }
  }
  return local_1;
}

Assistant:

bool xmrig::DaemonClient::parseResponse(int64_t id, const rapidjson::Value &result, const rapidjson::Value &error)
{
    if (id == -1) {
        return false;
    }

    if (error.IsObject()) {
        const char *message = error["message"].GetString();

        if (!handleSubmitResponse(id, message) && !isQuiet()) {
            LOG_ERR("[%s:%d] error: " RED_BOLD("\"%s\"") RED_S ", code: %d", m_pool.host().data(), m_pool.port(), message, error["code"].GetInt());
        }

        return false;
    }

    if (!result.IsObject()) {
        return false;
    }

    int code = -1;
    if (result.HasMember(kBlocktemplateBlob) && parseJob(result, &code)) {
        return true;
    }

    if (handleSubmitResponse(id)) {
        getBlockTemplate();
        return true;
    }


    return false;
}